

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O1

void __thiscall Js::RecyclableObject::RecyclableObject(RecyclableObject *this,Type *type)

{
  ScriptContext *pSVar1;
  ulong uVar2;
  
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01553070;
  Memory::Recycler::WBSetBit((char *)&this->type);
  (this->type).ptr = type;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->type);
  pSVar1 = Js::Type::GetScriptContext(type);
  uVar2 = (ulong)((this->type).ptr)->typeId;
  if (uVar2 < 0x58) {
    pSVar1->instanceCount[uVar2] = pSVar1->instanceCount[uVar2] + 1;
  }
  return;
}

Assistant:

RecyclableObject::RecyclableObject(Type * type) : type(type)
    {
#if DBG_EXTRAFIELD
        dtorCalled = false;
#ifdef HEAP_ENUMERATION_VALIDATION
        m_heapEnumValidationCookie = 0;
#endif
#endif
#if DBG || defined(PROFILE_TYPES)
#if ENABLE_NATIVE_CODEGEN
        if (!JITManager::GetJITManager()->IsOOPJITEnabled())
#endif
        {
            RecordAllocation(type->GetScriptContext());
        }
#endif
    }